

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_lots_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  int local_b0;
  int local_ac;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_none);
  iVar2 = 0x5dc;
  for (uVar1 = 300; uVar1 < 1000; uVar1 = uVar1 + 0xf) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_ac = iVar2;
    bhdct_insert(tc,&dict,key,&local_ac,'\x01');
    iVar2 = iVar2 + 0x4b;
  }
  iVar2 = 0x5dc;
  for (uVar1 = 300; uVar1 < 1000; uVar1 = uVar1 + 0xf) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_b0 = iVar2;
    bhdct_get(tc,&dict,key,&local_b0,'\0',1);
    iVar2 = iVar2 + 0x4b;
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_lots_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_insert(tc, &dict, key, IONIZE(i * 5, int), boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, IONIZE(i * 5, int), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}